

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O3

int Curl_blockread_all(connectdata *conn,curl_socket_t sockfd,char *buf,ssize_t buffersize,
                      ssize_t *n)

{
  int iVar1;
  CURLcode CVar2;
  time_t timeout_ms;
  size_t sVar3;
  long lVar4;
  ssize_t nread;
  ssize_t local_40;
  ssize_t *local_38;
  
  local_40 = 0;
  *n = 0;
  timeout_ms = Curl_timeleft(conn->data,(curltime *)0x0,true);
  if (-1 < timeout_ms) {
    lVar4 = 0;
    local_38 = n;
    do {
      iVar1 = Curl_socket_check(sockfd,-1,-1,timeout_ms);
      if (iVar1 < 1) {
        return -1;
      }
      CVar2 = Curl_read_plain(sockfd,buf,buffersize,&local_40);
      sVar3 = buffersize;
      if (CVar2 != CURLE_AGAIN) {
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
        sVar3 = buffersize - local_40;
        if (sVar3 == 0) {
          *local_38 = buffersize + lVar4;
          return 0;
        }
        if (local_40 == 0) {
          return -1;
        }
        buf = buf + local_40;
        lVar4 = lVar4 + local_40;
      }
      timeout_ms = Curl_timeleft(conn->data,(curltime *)0x0,true);
      buffersize = sVar3;
    } while (-1 < timeout_ms);
  }
  return 0x1c;
}

Assistant:

int Curl_blockread_all(struct connectdata *conn, /* connection data */
                       curl_socket_t sockfd,     /* read from this socket */
                       char *buf,                /* store read data here */
                       ssize_t buffersize,       /* max amount to read */
                       ssize_t *n)               /* amount bytes read */
{
  ssize_t nread = 0;
  ssize_t allread = 0;
  int result;
  *n = 0;
  for(;;) {
    timediff_t timeleft = Curl_timeleft(conn->data, NULL, TRUE);
    if(timeleft < 0) {
      /* we already got the timeout */
      result = CURLE_OPERATION_TIMEDOUT;
      break;
    }
    if(SOCKET_READABLE(sockfd, timeleft) <= 0) {
      result = ~CURLE_OK;
      break;
    }
    result = Curl_read_plain(sockfd, buf, buffersize, &nread);
    if(CURLE_AGAIN == result)
      continue;
    if(result)
      break;

    if(buffersize == nread) {
      allread += nread;
      *n = allread;
      result = CURLE_OK;
      break;
    }
    if(!nread) {
      result = ~CURLE_OK;
      break;
    }

    buffersize -= nread;
    buf += nread;
    allread += nread;
  }
  return result;
}